

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicy.cpp
# Opt level: O0

GMM_STATUS __thiscall GmmLib::GmmGen12CachePolicy::InitCachePolicy(GmmGen12CachePolicy *this)

{
  GMM_CACHE_POLICY_ELEMENT *pGVar1;
  GMM_CACHE_POLICY_ELEMENT CachePolicyUsage;
  ulong uVar2;
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar3;
  SKU_FEATURE_TABLE *pSVar4;
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar5;
  short sVar6;
  ushort uVar7;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  GMM_CACHE_POLICY_TBL_ELEMENT *local_50;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle_2;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle_1;
  GMM_CACHE_POLICY_TBL_ELEMENT *TblEle;
  GMM_CACHE_POLICY_TBL_ELEMENT UsageEle;
  uint64_t PTEValue;
  uint32_t j;
  int32_t CPTblIdx;
  bool SpecialMOCS;
  bool CachePolicyError;
  GmmGen12CachePolicy *pGStack_18;
  uint32_t Usage;
  GmmGen12CachePolicy *this_local;
  
  if ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy ==
      (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[1].field_1.Value = pGVar1[1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[2].field_1.Value = pGVar1[2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[3].field_1.Value = pGVar1[3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[4].field_1.Value = pGVar1[4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[5].field_1.Value = pGVar1[5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[6].field_1.Value = pGVar1[6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[7].field_1.Value = pGVar1[7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[8].field_1.Value = pGVar1[8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[9].field_1.Value = pGVar1[9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[10].field_1.Value = pGVar1[10].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb].field_1.Value = pGVar1[0xb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x14].field_1.Value = pGVar1[0x14].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc].field_1.Value = pGVar1[0xc].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd].field_1.Value = pGVar1[0xd].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe].field_1.Value = pGVar1[0xe].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf].field_1.Value = pGVar1[0xf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffffe3ff;
    pGStack_18 = this;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value =
         pGVar1[0x10].field_1.Value & 0xffffffffffffdfff |
         (ulong)(((ulong)pSVar4->field_1 >> 10 & 1) != 0) << 0xd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x10].field_1.Value = pGVar1[0x10].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11].field_1.Value = pGVar1[0x11].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x12].field_1.Value = pGVar1[0x12].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x13].field_1.Value = pGVar1[0x13].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x15].field_1.Value = pGVar1[0x15].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x16].field_1.Value = pGVar1[0x16].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    (pGVar1->field_1).Value = (pGVar1->field_1).Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x17].field_1.Value = pGVar1[0x17].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x18].field_1.Value = pGVar1[0x18].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x19].field_1.Value = pGVar1[0x19].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1a].field_1.Value = pGVar1[0x1a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1b].field_1.Value = pGVar1[0x1b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1c].field_1.Value = pGVar1[0x1c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1d].field_1.Value = pGVar1[0x1d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1e].field_1.Value = pGVar1[0x1e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x1f].field_1.Value = pGVar1[0x1f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffffb | 4;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xfffffffffffffff7 |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 3;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffffe3ff;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value =
         pGVar1[0x20].field_1.Value & 0xffffffffffffdfff |
         (ulong)(((ulong)pSVar4->field_1 >> 10 & 1) != 0) << 0xd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffffe7ffff | 0x180000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x20].field_1.Value = pGVar1[0x20].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x22].field_1.Value = pGVar1[0x22].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x23].field_1.Value = pGVar1[0x23].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x24].field_1.Value = pGVar1[0x24].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x25].field_1.Value = pGVar1[0x25].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x26].field_1.Value = pGVar1[0x26].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x27].field_1.Value = pGVar1[0x27].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x28].field_1.Value = pGVar1[0x28].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x29].field_1.Value = pGVar1[0x29].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2a].field_1.Value = pGVar1[0x2a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2b].field_1.Value = pGVar1[0x2b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2c].field_1.Value = pGVar1[0x2c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2d].field_1.Value = pGVar1[0x2d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2e].field_1.Value = pGVar1[0x2e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x2f].field_1.Value = pGVar1[0x2f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x30].field_1.Value = pGVar1[0x30].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x31].field_1.Value = pGVar1[0x31].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x32].field_1.Value = pGVar1[0x32].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x33].field_1.Value = pGVar1[0x33].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x34].field_1.Value = pGVar1[0x34].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x35].field_1.Value = pGVar1[0x35].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x36].field_1.Value = pGVar1[0x36].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x37].field_1.Value = pGVar1[0x37].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x38].field_1.Value = pGVar1[0x38].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffffe3ff;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value =
         pGVar1[0x3d].field_1.Value & 0xffffffffffffdfff |
         (ulong)(((ulong)pSVar4->field_1 >> 10 & 1) != 0) << 0xd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3d].field_1.Value = pGVar1[0x3d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x39].field_1.Value = pGVar1[0x39].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffffe7ffff | 0x100000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3a].field_1.Value = pGVar1[0x3a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value =
         pGVar1[0x3b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffffffb | 4;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value =
         pGVar1[0x3b].field_1.Value & 0xfffffffffffffff7 |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 3;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffffe3ff;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value =
         pGVar1[0x3b].field_1.Value & 0xffffffffffffdfff |
         (ulong)(((ulong)pSVar4->field_1 >> 10 & 1) != 0) << 0xd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffffe7ffff | 0x180000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3b].field_1.Value = pGVar1[0x3b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3e].field_1.Value = pGVar1[0x3e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x41].field_1.Value = pGVar1[0x41].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x42].field_1.Value = pGVar1[0x42].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x43].field_1.Value = pGVar1[0x43].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x40].field_1.Value = pGVar1[0x40].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x44].field_1.Value = pGVar1[0x44].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x45].field_1.Value = pGVar1[0x45].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x46].field_1.Value = pGVar1[0x46].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x47].field_1.Value = pGVar1[0x47].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4d].field_1.Value = pGVar1[0x4d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x48].field_1.Value = pGVar1[0x48].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x49].field_1.Value = pGVar1[0x49].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4a].field_1.Value = pGVar1[0x4a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4b].field_1.Value = pGVar1[0x4b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4c].field_1.Value = pGVar1[0x4c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x4e].field_1.Value = pGVar1[0x4e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x50].field_1.Value = pGVar1[0x50].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x51].field_1.Value = pGVar1[0x51].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x52].field_1.Value = pGVar1[0x52].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x53].field_1.Value = pGVar1[0x53].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x54].field_1.Value = pGVar1[0x54].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x55].field_1.Value = pGVar1[0x55].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5d].field_1.Value = pGVar1[0x5d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x56].field_1.Value = pGVar1[0x56].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x57].field_1.Value = pGVar1[0x57].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x58].field_1.Value = pGVar1[0x58].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x59].field_1.Value = pGVar1[0x59].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5a].field_1.Value = pGVar1[0x5a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5b].field_1.Value = pGVar1[0x5b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5c].field_1.Value = pGVar1[0x5c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5e].field_1.Value = pGVar1[0x5e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x5f].field_1.Value = pGVar1[0x5f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x62].field_1.Value = pGVar1[0x62].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6d].field_1.Value = pGVar1[0x6d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x6e].field_1.Value = pGVar1[0x6e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x70].field_1.Value = pGVar1[0x70].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffffcf | 0x10;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x71].field_1.Value = pGVar1[0x71].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value =
         pGVar1[0x73].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x73].field_1.Value = pGVar1[0x73].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value =
         pGVar1[0x75].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x75].field_1.Value = pGVar1[0x75].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value =
         pGVar1[0x76].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x76].field_1.Value = pGVar1[0x76].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value =
         pGVar1[0x77].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x77].field_1.Value = pGVar1[0x77].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x78].field_1.Value = pGVar1[0x78].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value =
         pGVar1[0x79].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x79].field_1.Value = pGVar1[0x79].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value =
         pGVar1[0x7a].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7a].field_1.Value = pGVar1[0x7a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value =
         pGVar1[0x7b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7b].field_1.Value = pGVar1[0x7b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value =
         pGVar1[0x7c].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7c].field_1.Value = pGVar1[0x7c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value =
         pGVar1[0x7d].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7d].field_1.Value = pGVar1[0x7d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value =
         pGVar1[0x7e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7e].field_1.Value = pGVar1[0x7e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value =
         pGVar1[0x7f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x7f].field_1.Value = pGVar1[0x7f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value =
         pGVar1[0x80].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x80].field_1.Value = pGVar1[0x80].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value =
         pGVar1[0x81].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x81].field_1.Value = pGVar1[0x81].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value =
         pGVar1[0x82].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x82].field_1.Value = pGVar1[0x82].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value =
         pGVar1[0x83].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x83].field_1.Value = pGVar1[0x83].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value =
         pGVar1[0x84].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x84].field_1.Value = pGVar1[0x84].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value =
         pGVar1[0x85].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x85].field_1.Value = pGVar1[0x85].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value =
         pGVar1[0x86].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x86].field_1.Value = pGVar1[0x86].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value =
         pGVar1[0x87].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x87].field_1.Value = pGVar1[0x87].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value =
         pGVar1[0x88].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x88].field_1.Value = pGVar1[0x88].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value =
         pGVar1[0x89].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x89].field_1.Value = pGVar1[0x89].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value =
         pGVar1[0x8b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8b].field_1.Value = pGVar1[0x8b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value =
         pGVar1[0x8c].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8c].field_1.Value = pGVar1[0x8c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value =
         pGVar1[0x8d].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8d].field_1.Value = pGVar1[0x8d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value =
         pGVar1[0x8e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8e].field_1.Value = pGVar1[0x8e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value =
         pGVar1[0x8f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x8f].field_1.Value = pGVar1[0x8f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value =
         pGVar1[0x90].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x90].field_1.Value = pGVar1[0x90].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa1].field_1.Value = pGVar1[0xa1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value =
         pGVar1[0xa2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa2].field_1.Value = pGVar1[0xa2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value =
         pGVar1[0x99].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x99].field_1.Value = pGVar1[0x99].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value =
         pGVar1[0x9a].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9a].field_1.Value = pGVar1[0x9a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value =
         pGVar1[0x9b].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9b].field_1.Value = pGVar1[0x9b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9c].field_1.Value = pGVar1[0x9c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9d].field_1.Value = pGVar1[0x9d].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value =
         pGVar1[0x9e].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9e].field_1.Value = pGVar1[0x9e].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value =
         pGVar1[0x9f].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x9f].field_1.Value = pGVar1[0x9f].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value =
         pGVar1[0xa0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa0].field_1.Value = pGVar1[0xa0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa4].field_1.Value = pGVar1[0xa4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value =
         pGVar1[0xa5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa5].field_1.Value = pGVar1[0xa5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa6].field_1.Value = pGVar1[0xa6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value =
         pGVar1[0xa7].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa7].field_1.Value = pGVar1[0xa7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value =
         pGVar1[0xa8].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa8].field_1.Value = pGVar1[0xa8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb1].field_1.Value = pGVar1[0xb1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value =
         pGVar1[0xb2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb2].field_1.Value = pGVar1[0xb2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value =
         pGVar1[0xb3].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb3].field_1.Value = pGVar1[0xb3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value =
         pGVar1[0xb4].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb4].field_1.Value = pGVar1[0xb4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffffffffffffe;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value =
         pGVar1[0x3c].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffffffffffffb | 4;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value =
         pGVar1[0x3c].field_1.Value & 0xfffffffffffffff7 |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 3;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffffffffe3ff;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value =
         pGVar1[0x3c].field_1.Value & 0xffffffffffffdfff |
         (ulong)(((ulong)pSVar4->field_1 >> 10 & 1) != 0) << 0xd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffffffe7ffff | 0x180000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x3c].field_1.Value = pGVar1[0x3c].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value =
         pGVar1[0xb5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb5].field_1.Value = pGVar1[0xb5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value =
         pGVar1[0xb6].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb6].field_1.Value = pGVar1[0xb6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value =
         pGVar1[0xb7].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb7].field_1.Value = pGVar1[0xb7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value =
         pGVar1[0xb8].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb8].field_1.Value = pGVar1[0xb8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value =
         pGVar1[0xb9].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb9].field_1.Value = pGVar1[0xb9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value =
         pGVar1[0xba].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xba].field_1.Value = pGVar1[0xba].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value =
         pGVar1[0xbb].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbb].field_1.Value = pGVar1[0xbb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value =
         pGVar1[0xbc].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbc].field_1.Value = pGVar1[0xbc].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value =
         pGVar1[0xbd].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbd].field_1.Value = pGVar1[0xbd].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value =
         pGVar1[0xbe].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbe].field_1.Value = pGVar1[0xbe].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value =
         pGVar1[0xbf].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xbf].field_1.Value = pGVar1[0xbf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value =
         pGVar1[0xc0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc0].field_1.Value = pGVar1[0xc0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value =
         pGVar1[0xc1].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc1].field_1.Value = pGVar1[0xc1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value =
         pGVar1[0xc2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc2].field_1.Value = pGVar1[0xc2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value =
         pGVar1[0xc3].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc3].field_1.Value = pGVar1[0xc3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value =
         pGVar1[0xc4].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc4].field_1.Value = pGVar1[0xc4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value =
         pGVar1[0xc5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc5].field_1.Value = pGVar1[0xc5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc6].field_1.Value = pGVar1[0xc6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value =
         pGVar1[199].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[199].field_1.Value = pGVar1[199].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value =
         pGVar1[200].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[200].field_1.Value = pGVar1[200].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value =
         pGVar1[0xc9].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xc9].field_1.Value = pGVar1[0xc9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value =
         pGVar1[0xca].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xca].field_1.Value = pGVar1[0xca].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value =
         pGVar1[0xcb].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcb].field_1.Value = pGVar1[0xcb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value =
         pGVar1[0xcc].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcc].field_1.Value = pGVar1[0xcc].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value =
         pGVar1[0xcd].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcd].field_1.Value = pGVar1[0xcd].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value =
         pGVar1[0xce].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xce].field_1.Value = pGVar1[0xce].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value =
         pGVar1[0xcf].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xcf].field_1.Value = pGVar1[0xcf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value =
         pGVar1[0xd0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd0].field_1.Value = pGVar1[0xd0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value =
         pGVar1[0xd1].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd1].field_1.Value = pGVar1[0xd1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value =
         pGVar1[0xd2].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd2].field_1.Value = pGVar1[0xd2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value =
         pGVar1[0xd3].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd3].field_1.Value = pGVar1[0xd3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value =
         pGVar1[0xd4].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd4].field_1.Value = pGVar1[0xd4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value =
         pGVar1[0xd5].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd5].field_1.Value = pGVar1[0xd5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value =
         pGVar1[0xd6].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd6].field_1.Value = pGVar1[0xd6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value =
         pGVar1[0xd7].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd7].field_1.Value = pGVar1[0xd7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value =
         pGVar1[0xd8].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd8].field_1.Value = pGVar1[0xd8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value =
         pGVar1[0xd9].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xd9].field_1.Value = pGVar1[0xd9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value =
         pGVar1[0xda].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xda].field_1.Value = pGVar1[0xda].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value =
         pGVar1[0x91].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x91].field_1.Value = pGVar1[0x91].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value =
         pGVar1[0xa9].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xa9].field_1.Value = pGVar1[0xa9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value =
         pGVar1[0xaa].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaa].field_1.Value = pGVar1[0xaa].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value =
         pGVar1[0xab].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xab].field_1.Value = pGVar1[0xab].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value =
         pGVar1[0xac].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xac].field_1.Value = pGVar1[0xac].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value =
         pGVar1[0xad].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xad].field_1.Value = pGVar1[0xad].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value =
         pGVar1[0x97].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x97].field_1.Value = pGVar1[0x97].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value =
         pGVar1[0xae].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xae].field_1.Value = pGVar1[0xae].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value =
         pGVar1[0xaf].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xaf].field_1.Value = pGVar1[0xaf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffffffffffe | 1;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value =
         pGVar1[0xb0].field_1.Value & 0xfffffffffffffffd |
         (ulong)(((ulong)pSVar4->field_1 >> 9 & 1) != 0) << 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xb0].field_1.Value = pGVar1[0xb0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdc].field_1.Value = pGVar1[0xdc].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdd].field_1.Value = pGVar1[0xdd].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xde].field_1.Value = pGVar1[0xde].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xdf].field_1.Value = pGVar1[0xdf].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe0].field_1.Value = pGVar1[0xe0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe1].field_1.Value = pGVar1[0xe1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffffbffff | 0x40000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe2].field_1.Value = pGVar1[0xe2].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe3].field_1.Value = pGVar1[0xe3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe4].field_1.Value = pGVar1[0xe4].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe5].field_1.Value = pGVar1[0xe5].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe6].field_1.Value = pGVar1[0xe6].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe7].field_1.Value = pGVar1[0xe7].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe8].field_1.Value = pGVar1[0xe8].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xe9].field_1.Value = pGVar1[0xe9].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xea].field_1.Value = pGVar1[0xea].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xeb].field_1.Value = pGVar1[0xeb].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffe | 1;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffffcf | 0x30;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffcffff | 0x30000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xed].field_1.Value = pGVar1[0xed].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf0].field_1.Value = pGVar1[0xf0].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf1].field_1.Value = pGVar1[0xf1].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf2].field_1.Value = pGVar1[0xf2].field_1.Value & 0xffefffffffffffff;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value =
         pGVar1[0xf3].field_1.Value & 0xfffffffffffffffe |
         (ulong)(((ulong)pSVar4->field_1 >> 0x16 & 1) != 0);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffff7;
    pSVar4 = Context::GetSkuTable
                       ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                        super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon
                        .pGmmLibContext);
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value =
         pGVar1[0xf3].field_1.Value & 0xffffffffffffffcf |
         (ulong)(((ulong)pSVar4->field_1 >> 0x16 & 1) != 0) << 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0xf3].field_1.Value = pGVar1[0xf3].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x118].field_1.Value = pGVar1[0x118].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x119].field_1.Value = pGVar1[0x119].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11a].field_1.Value = pGVar1[0x11a].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffd;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffffb;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffffe7ffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11b].field_1.Value = pGVar1[0x11b].field_1.Value & 0xffefffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffffffffe;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffffffffd | 2;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffffffffb | 4;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffffffff7;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffffffffcf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffffffffbf;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffffffc7f;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffffffe3ff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffffffdfff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffffcffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffffff3fff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffffbffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffffe7ffff | 0x80000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffff1fffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffeffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffffdffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffe3ffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffffdfffffff | 0x20000000;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffffffff3fffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffffcffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffffff3ffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfffcffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xfff3ffffffffffff;
    pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
    pGVar1[0x11c].field_1.Value = pGVar1[0x11c].field_1.Value & 0xffefffffffffffff;
    SetUpMOCSTable(this);
    for (CPTblIdx = 0; (uint)CPTblIdx < 0x11e; CPTblIdx = CPTblIdx + 1) {
      j._3_1_ = 0;
      j._2_1_ = 0;
      UsageEle.LeCC = (anon_union_4_3_53f8f047_for_LeCC)0x0;
      UsageEle.L3 = (anon_union_2_3_6e525fdd_for_L3)0x0;
      UsageEle.HDCL1 = '\0';
      UsageEle._7_1_ = 0;
      TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)0x0;
      PTEValue._4_4_ = IsSpecialMOCSUsage(this,CPTblIdx,(bool *)((long)&j + 2));
      TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)((ulong)TblEle & 0xffffffff0000787f);
      if ((((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
            super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1
            .Value >> 0xd & 1) != 0) &&
         (pSVar4 = Context::GetSkuTable
                             ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                              super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                              super_GmmCachePolicyCommon.pGmmLibContext),
         ((ulong)pSVar4->field_1 >> 10 & 1) != 0)) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)
                 CONCAT44(TblEle._4_4_,
                          (uint)TblEle & 0xffffbfff |
                          ((uint)((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                                  super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                  super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
                                  Value >> 0xd) & 1) << 0xe);
      }
      if (((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
           Value & 0x10000) != 0) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)
                 CONCAT44(TblEle._4_4_,
                          (uint)TblEle & 0xfff9ffff |
                          ((uint)((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                                  super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                  super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
                                  Value >> 0x10) & 3) << 0x11);
      }
      if (((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
           Value >> 0xe & 3) != 0) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)
                 CONCAT44(TblEle._4_4_,
                          (uint)TblEle & 0xfffe7fff |
                          ((uint)((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                                  super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                  super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
                                  Value >> 0xe) & 3) << 0xf);
      }
      if (((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
           Value >> 0x12 & 1) != 0) {
        TblEle._0_7_ = CONCAT16(1,TblEle._0_6_);
      }
      if (((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
           Value >> 7 & 7) != 0) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)
                 (CONCAT44(TblEle._4_4_,
                           (uint)TblEle & 0xfffff8ff |
                           ((uint)((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                                   super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                   super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
                                   Value >> 7) & 7) << 8) & 0xffffffffffffff7f | 0x80);
      }
      uVar2 = CONCAT44(TblEle._4_4_,
                       (uint)TblEle & 0xffffffcf |
                       ((uint)((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                               super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                               super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.Value
                              >> 4) & 3) << 4);
      if (((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
           Value & 1) == 0) {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)(uVar2 & 0xfffffffffffffff0 | 5);
      }
      else {
        TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)(uVar2 & 0xfffffffffffffff0 | 7);
      }
      TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)((ulong)TblEle & 0xffff00f0ffffffff);
      pGVar5 = TblEle;
      sVar6 = 1;
      if (((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
           Value >> 2 & 1) != 0) {
        sVar6 = 3;
      }
      uVar7 = TblEle._4_2_ & 0xffcf | sVar6 << 4;
      if (((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
           super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.
           Value >> 10 & 7) != 0) {
        TblEle._4_2_ = uVar7 | 1;
        uVar7 = TblEle._4_2_ |
                ((ushort)((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].field_1.Value >>
                         10) & 7) << 1;
      }
      TblEle = (GMM_CACHE_POLICY_TBL_ELEMENT *)CONCAT26(TblEle._6_2_,CONCAT24(uVar7,(uint)TblEle));
      pGVar3 = TblEle;
      if ((int)PTEValue._4_4_ < 0x3c) {
        TblEle._6_1_ = SUB81(pGVar5,6);
        TblEle = pGVar3;
        if (TblEle._6_1_ == '\0') {
          for (PTEValue._0_4_ = 1;
              (uint)PTEValue <=
              (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              CurrentMaxMocsIndex; PTEValue._0_4_ = (uint)PTEValue + 1) {
            local_50 = Context::GetCachePolicyTlbElement
                                 ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                                  super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                  super_GmmCachePolicyCommon.pGmmLibContext);
            local_50 = local_50 + (uint)PTEValue;
            if ((((local_50->LeCC).DwordValue == (uint)TblEle) &&
                ((local_50->L3).UshortValue == TblEle._4_2_)) && (local_50->HDCL1 == TblEle._6_1_))
            {
              PTEValue._4_4_ = (uint)PTEValue;
              break;
            }
          }
        }
        else {
          for (PTEValue._0_4_ = 0x30;
              (uint)PTEValue <=
              (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
              CurrentMaxL1HdcMocsIndex; PTEValue._0_4_ = (uint)PTEValue + 1) {
            pGVar5 = Context::GetCachePolicyTlbElement
                               ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                                super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                super_GmmCachePolicyCommon.pGmmLibContext);
            TblEle_2 = pGVar5 + (uint)PTEValue;
            if ((((TblEle_2->LeCC).DwordValue == (uint)TblEle) &&
                ((TblEle_2->L3).UshortValue == TblEle._4_2_)) && (TblEle_2->HDCL1 == TblEle._6_1_))
            {
              PTEValue._4_4_ = (uint)PTEValue;
              break;
            }
          }
        }
      }
      else {
        pGVar5 = Context::GetCachePolicyTlbElement
                           ((this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.
                            super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                            super_GmmCachePolicyCommon.pGmmLibContext);
        TblEle_1 = pGVar5 + (int)PTEValue._4_4_;
      }
      if (PTEValue._4_4_ == 0xffffffff) {
        j._3_1_ = 1;
        PTEValue._4_4_ = 3;
      }
      memcpy(&local_78,
             (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
             super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy + (uint)CPTblIdx,0x28)
      ;
      CachePolicyUsage.field_1 =
           (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)uStack_70;
      CachePolicyUsage._0_8_ = local_78;
      CachePolicyUsage.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)(undefined4)local_68;
      CachePolicyUsage.field_3 =
           (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)local_68._4_4_;
      CachePolicyUsage.PTE = (GMM_PTE_CACHE_CONTROL_BITS)uStack_60;
      CachePolicyUsage.Override = (undefined4)local_58;
      CachePolicyUsage.IsOverridenByRegkey = local_58._4_4_;
      GmmGen8CachePolicy::GetUsagePTEValue
                ((GmmGen8CachePolicy *)this,CachePolicyUsage,CPTblIdx,(uint64_t *)&UsageEle);
      (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].PTE.field_4.
      DwordValue = (uint32_t)UsageEle.LeCC;
      (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].PTE.field_4.
      HighDwordValue = 0;
      pGVar1 = (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy;
      pGVar1[(uint)CPTblIdx].MemoryObjectOverride.DwordValue =
           pGVar1[(uint)CPTblIdx].MemoryObjectOverride.DwordValue & 0xffffff81 |
           (PTEValue._4_4_ & 0x3f) << 1;
      (this->super_GmmGen11CachePolicy).super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.pCachePolicy[(uint)CPTblIdx].Override =
           0xffffffff;
    }
    this_local._4_4_ = GMM_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmGen12CachePolicy::InitCachePolicy()
{

    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, llc, ellc, l3, wt, age, aom, lecc_scc, l3_scc, scf, sso, cos, hdcl1, l3evict) DEFINE_CP_ELEMENT(usage, llc, ellc, l3, wt, age, aom, lecc_scc, l3_scc, scf, sso, cos, hdcl1, l3evict, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0)

#include "GmmGen12CachePolicy.h"

#define TC_LLC (1)
#define TC_ELLC (0)
#define TC_LLC_ELLC (2)

#define LeCC_UNCACHEABLE (0x0)
#define LeCC_WC_UNCACHEABLE (0x1)
#define LeCC_WT_CACHEABLE (0x2) //Only used as MemPushWRite disqualifier if set along with eLLC-only -still holds on gen12+?
#define LeCC_WB_CACHEABLE (0x3)

#define L3_UNCACHEABLE (0x1)
#define L3_WB_CACHEABLE (0x3)

#define DISABLE_SKIP_CACHING_CONTROL (0x0)
#define ENABLE_SKIP_CACHING_CONTROL (0x1)

#define DISABLE_SELF_SNOOP_OVERRIDE (0x0)
#define ENABLE_SELF_SNOOP_OVERRIDE (0x1)
#define ENABLE_SELF_SNOOP_ALWAYS (0x3)
#define CLASS_SERVICE_ZERO (0x0)

    {
        SetUpMOCSTable();
    }

    {
        // Define index of cache element
        uint32_t Usage = 0;

#if(_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
        void *pKmdGmmContext = NULL;

        OverrideCachePolicy(pKmdGmmContext);
#endif
        // Process the cache policy and fill in the look up table
        for(; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
        {
            bool                         CachePolicyError = false;
            bool                         SpecialMOCS      = false;
            int32_t                      CPTblIdx         = -1;
            uint32_t                     j                = 0;
            uint64_t                     PTEValue         = 0;
            GMM_CACHE_POLICY_TBL_ELEMENT UsageEle         = {0};

            CPTblIdx = IsSpecialMOCSUsage((GMM_RESOURCE_USAGE_TYPE)Usage, SpecialMOCS);

            UsageEle.LeCC.Reserved = 0; // Reserved bits zeroe'd, this is so we
                                        // we can compare the unioned LeCC.DwordValue.
            UsageEle.LeCC.SelfSnoop = DISABLE_SELF_SNOOP_OVERRIDE;
            UsageEle.LeCC.CoS       = CLASS_SERVICE_ZERO;
            UsageEle.LeCC.SCC       = 0;
            UsageEle.LeCC.ESC       = 0;

            if(pCachePolicy[Usage].SCF && pGmmLibContext->GetSkuTable().FtrLLCBypass)
            {
                UsageEle.LeCC.SCF = pCachePolicy[Usage].SCF;
                __GMM_ASSERT(pCachePolicy[Usage].LLC == 0); //LLC and ByPassLLC are mutually-exclusive
            }

            if(pCachePolicy[Usage].SSO & ENABLE_SELF_SNOOP_OVERRIDE)
            {
                UsageEle.LeCC.SelfSnoop = pCachePolicy[Usage].SSO & ENABLE_SELF_SNOOP_ALWAYS;
            }
            if(pCachePolicy[Usage].CoS)
            {
                UsageEle.LeCC.CoS = pCachePolicy[Usage].CoS;
            }
            if(pCachePolicy[Usage].HDCL1)
            {
                UsageEle.HDCL1 = 1;
            }
            if(pCachePolicy[Usage].LeCC_SCC)
            {
                UsageEle.LeCC.SCC = pCachePolicy[Usage].LeCC_SCC;
                UsageEle.LeCC.ESC = ENABLE_SKIP_CACHING_CONTROL;
            }
            UsageEle.LeCC.LRUM = pCachePolicy[Usage].AGE;

            // default to LLC target cache.
            UsageEle.LeCC.TargetCache  = TC_LLC;
            UsageEle.LeCC.Cacheability = LeCC_WB_CACHEABLE;
            if(pCachePolicy[Usage].LLC)
            {
                UsageEle.LeCC.TargetCache = TC_LLC;
                __GMM_ASSERT(pCachePolicy[Usage].SCF == 0); //LLC and ByPassLLC are mutually-exclusive
            }
            else
            {
                UsageEle.LeCC.Cacheability = LeCC_WC_UNCACHEABLE;
            }
            UsageEle.L3.Reserved = 0; // Reserved bits zeroe'd, this is so we
                                      // we can compare the unioned L3.UshortValue.
            UsageEle.L3.ESC          = DISABLE_SKIP_CACHING_CONTROL;
            UsageEle.L3.SCC          = 0;
            UsageEle.L3.Cacheability = pCachePolicy[Usage].L3 ? L3_WB_CACHEABLE : L3_UNCACHEABLE;

            __GMM_ASSERT((pCachePolicy[Usage].L3 && pCachePolicy[Usage].L3Eviction != 0) ||
                         (pCachePolicy[Usage].L3 == 0 && (pCachePolicy[Usage].L3Eviction == 0 || Usage == GMM_RESOURCE_USAGE_L3_EVICTION)));

            if(pCachePolicy[Usage].L3_SCC)
            {
                UsageEle.L3.ESC = ENABLE_SKIP_CACHING_CONTROL;
                UsageEle.L3.SCC = (uint16_t)pCachePolicy[Usage].L3_SCC;
            }

            //Special-case MOCS handling for MOCS Table Index 60-63
            if(CPTblIdx >= GMM_GEN12_MAX_NUMBER_MOCS_INDEXES)
            {
                GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[CPTblIdx];

                if(SpecialMOCS &&
                   !(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                     TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                     TblEle->HDCL1 == UsageEle.HDCL1))
                {
                    //Assert if being overwritten!
                    __GMM_ASSERT(TblEle->LeCC.DwordValue == 0 &&
                                 TblEle->L3.UshortValue == 0 &&
                                 TblEle->HDCL1 == 0);

#if(_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
                    if(pCachePolicy[Usage].IsOverridenByRegkey)
                    {
                        TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                        TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                        TblEle->HDCL1           = UsageEle.HDCL1;
                    }
#endif
                }
            }
            //For HDC L1 caching, MOCS Table index 48-59 should be used
            else if(UsageEle.HDCL1)
            {
                for(j = GMM_GEN10_HDCL1_MOCS_INDEX_START; j <= CurrentMaxL1HdcMocsIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];
                    if(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                       TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }
            else
            {
                // Due to unstable system behavior on TGLLP, MOCS #0 index had to be programmed as UC in MOCS lookup table - pCachePolicyTlbElement
                // But still Index 0 is Reserved for Error by HW and should not be used.
                // Hence Gmmlib will opt out from the MOCS#0 usage and Lookup into MOCS table and MOCS index assigment must start from Index 1.
                for(j = 1; j <= CurrentMaxMocsIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];
                    if(TblEle->LeCC.DwordValue == UsageEle.LeCC.DwordValue &&
                       TblEle->L3.UshortValue == UsageEle.L3.UshortValue &&
                       TblEle->HDCL1 == UsageEle.HDCL1)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }

            // Didn't find the caching settings in one of the already programmed lookup table entries.
            // Need to add a new lookup table entry.
            if(CPTblIdx == -1)
            {

#if(_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
                // If the Cache Policy setting is overriden through regkey,
                // don't raise an assert/log error. Raising an assert for debug/perf testing isn't really helpful
                if(pCachePolicy[Usage].IsOverridenByRegkey)
                {
                    if(UsageEle.HDCL1 && CurrentMaxL1HdcMocsIndex < GMM_GEN12_MAX_NUMBER_MOCS_INDEXES - 1)
                    {
                        GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &(pGmmLibContext->GetCachePolicyTlbElement()[++CurrentMaxL1HdcMocsIndex]);
                        CPTblIdx                             = CurrentMaxL1HdcMocsIndex;

                        TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                        TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                        TblEle->HDCL1           = UsageEle.HDCL1;
                    }
                    else if(CurrentMaxMocsIndex < GMM_GEN10_HDCL1_MOCS_INDEX_START)
                    {
                        GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &(pGmmLibContext->GetCachePolicyTlbElement()[++CurrentMaxMocsIndex]);
                        CPTblIdx                             = CurrentMaxMocsIndex;

                        TblEle->LeCC.DwordValue = UsageEle.LeCC.DwordValue;
                        TblEle->L3.UshortValue  = UsageEle.L3.UshortValue;
                        TblEle->HDCL1           = UsageEle.HDCL1;
                    }
                    else
                    {
                        // Too many unique caching combinations to program the
                        // MOCS lookup table.
                        CachePolicyError = true;
                        GMM_ASSERTDPF(
                        "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                        "(we only support GMM_GEN_MAX_NUMBER_MOCS_INDEXES = %d)",
                        GMM_MAX_NUMBER_MOCS_INDEXES - 1);
                        // Set cache policy index to uncached.
                        CPTblIdx = 3;
                    }
                }
                else
#endif
                {
                    GMM_ASSERTDPF(false, "CRITICAL ERROR: Cache Policy Usage value specified by Client is not defined in Fixed MOCS Table!");

                    CachePolicyError = true;
                    GMM_ASSERTDPF(
                    "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                    "(we only support GMM_GEN_MAX_NUMBER_MOCS_INDEXES = %d)",
                    CurrentMaxMocsIndex);

                    // Set cache policy index to uncached.
                    CPTblIdx = 3;
                }
            }

            // PTE entries do not control caching on SKL+ (for legacy context)
            if(!GetUsagePTEValue(pCachePolicy[Usage], Usage, &PTEValue))
            {
                CachePolicyError = true;
            }

            pCachePolicy[Usage].PTE.DwordValue     = PTEValue & 0xFFFFFFFF;
            pCachePolicy[Usage].PTE.HighDwordValue = 0;

            pCachePolicy[Usage].MemoryObjectOverride.Gen12.Index = CPTblIdx;

            pCachePolicy[Usage].Override = ALWAYS_OVERRIDE;

            if(CachePolicyError)
            {
                GMM_ASSERTDPF("Cache Policy Init Error: Invalid Cache Programming - Element %d", Usage);
            }
        }
    }

    return GMM_SUCCESS;
}